

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_set.c
# Opt level: O0

int mpt_path_set(mpt_path *path,char *val,int len)

{
  char cVar1;
  char cVar2;
  size_t sVar3;
  int iVar4;
  size_t sVar5;
  bool bVar6;
  uint8_t local_58;
  size_t local_50;
  int local_44;
  char curr;
  char assign;
  char sep;
  long lStack_40;
  int elem;
  size_t add;
  size_t first;
  size_t plen;
  size_t vlen;
  int len_local;
  char *val_local;
  mpt_path *path_local;
  
  first = 0;
  add = 0;
  lStack_40 = 1;
  local_44 = 0;
  cVar1 = path->sep;
  cVar2 = path->assign;
  sVar5 = first;
  if (val == (char *)0x0) {
    lStack_40 = 0;
    plen = 0;
  }
  else {
    if (len < 0) {
      sVar3 = strlen(val);
      local_50 = sVar3 + 1;
    }
    else {
      local_50 = (size_t)len;
    }
    plen = local_50;
  }
  do {
    first = sVar5;
    if (plen <= first) {
LAB_001119c6:
      mpt_path_fini(path);
      path->base = val;
      path->off = 0;
      path->len = first + lStack_40;
      if (add < 0x100) {
        local_58 = (uint8_t)add;
      }
      else {
        local_58 = '\0';
      }
      path->first = local_58;
      path->sep = cVar1;
      path->assign = cVar2;
      path->flags = '\0';
      return local_44;
    }
    sVar5 = first + 1;
    if (val[first] == cVar2) {
      lStack_40 = 0;
      local_44 = local_44 + 1;
      first = sVar5;
      goto LAB_001119c6;
    }
    if ((val[first] == cVar1) &&
       (iVar4 = local_44 + 1, bVar6 = local_44 == 0, local_44 = iVar4, bVar6)) {
      add = first;
    }
  } while( true );
}

Assistant:

extern int mpt_path_set(MPT_STRUCT(path) *path, const char *val, int len)
{
	size_t vlen, plen = 0, first = 0, add = 1;
	int elem = 0;
	char sep, assign;
	
	sep = path->sep;
	assign = path->assign;
	
	if (!val) {
		vlen = add = 0;
	} else {
		vlen = (len < 0) ? strlen(val) + 1 : (size_t) len;
	}
	
	while (plen < vlen) {
		char curr = val[plen++];
		
		/* inline assignment */
		if (curr == assign) {
			add = 0;
			++elem;
			break;
		}
		/* separator found, save length of first part */
		if ((curr == sep) && !elem++) {
			first = plen - 1;
		}
	}
	mpt_path_fini(path);
	
	path->base = val;
	path->off  = 0;
	path->len  = plen + add;
	
	path->first  = (first > UINT8_MAX) ? 0 : first;
	path->sep    = sep;
	path->assign = assign;
	path->flags  = 0;
	
	return elem;
}